

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__fancy_alpha_weight_4ch(float *out_buffer,int width_times_channels)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  float *pfVar5;
  float *pfVar6;
  __m128 p;
  __m128 a;
  __m128 d;
  __m128 p1;
  __m128 p0;
  __m128 a1;
  __m128 d1;
  __m128 a0;
  __m128 d0;
  float *decode;
  float *end_decode;
  float *out;
  int width_times_channels_local;
  float *out_buffer_local;
  float fStack_8c;
  float fStack_7c;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float local_48;
  float fStack_44;
  float fStack_40;
  float local_28;
  float fStack_24;
  float fStack_20;
  
  pfVar6 = out_buffer + (width_times_channels / 4) * 7;
  end_decode = out_buffer;
  pfVar5 = pfVar6 + -(long)width_times_channels;
  while (d0._8_8_ = pfVar5 + 8, (ulong)d0._8_8_ <= pfVar6) {
    uVar1 = *(undefined8 *)pfVar5;
    uVar2 = *(undefined8 *)(pfVar5 + 2);
    uVar3 = *(undefined8 *)(pfVar5 + 4);
    uVar4 = *(undefined8 *)(pfVar5 + 6);
    fStack_6c = (float)((ulong)uVar2 >> 0x20);
    fStack_7c = (float)((ulong)uVar4 >> 0x20);
    local_28 = (float)uVar1;
    fStack_24 = (float)((ulong)uVar1 >> 0x20);
    fStack_20 = (float)uVar2;
    local_48 = (float)uVar3;
    fStack_44 = (float)((ulong)uVar3 >> 0x20);
    fStack_40 = (float)uVar4;
    *(undefined8 *)end_decode = uVar1;
    *(undefined8 *)(end_decode + 2) = uVar2;
    *(ulong *)(end_decode + 4) = CONCAT44(fStack_6c * fStack_24,fStack_6c * local_28);
    *(ulong *)(end_decode + 6) = CONCAT44(fStack_6c * fStack_6c,fStack_6c * fStack_20);
    *(undefined8 *)(end_decode + 7) = uVar3;
    *(undefined8 *)(end_decode + 9) = uVar4;
    *(ulong *)(end_decode + 0xb) = CONCAT44(fStack_7c * fStack_44,fStack_7c * local_48);
    *(ulong *)(end_decode + 0xd) = CONCAT44(fStack_7c * fStack_7c,fStack_7c * fStack_40);
    end_decode = end_decode + 0xe;
    pfVar5 = (float *)d0._8_8_;
  }
  if (pfVar5 < pfVar6) {
    uVar1 = *(undefined8 *)pfVar5;
    uVar2 = *(undefined8 *)(pfVar5 + 2);
    fStack_8c = (float)((ulong)uVar2 >> 0x20);
    local_68 = (float)uVar1;
    fStack_64 = (float)((ulong)uVar1 >> 0x20);
    fStack_60 = (float)uVar2;
    *(undefined8 *)end_decode = uVar1;
    *(undefined8 *)(end_decode + 2) = uVar2;
    *(ulong *)(end_decode + 4) = CONCAT44(fStack_8c * fStack_64,fStack_8c * local_68);
    *(ulong *)(end_decode + 6) = CONCAT44(fStack_8c * fStack_8c,fStack_8c * fStack_60);
  }
  return;
}

Assistant:

static void stbir__fancy_alpha_weight_4ch( float * out_buffer, int width_times_channels )
{
  float STBIR_STREAMOUT_PTR(*) out = out_buffer;
  float const * end_decode = out_buffer + ( width_times_channels / 4 ) * 7;  // decode buffer aligned to end of out_buffer
  float STBIR_STREAMOUT_PTR(*) decode = (float*)end_decode - width_times_channels;

  // fancy alpha is stored internally as R G B A Rpm Gpm Bpm

  #ifdef STBIR_SIMD

  #ifdef STBIR_SIMD8
  decode += 16;
  STBIR_NO_UNROLL_LOOP_START
  while ( decode <= end_decode )
  {
    stbir__simdf8 d0,d1,a0,a1,p0,p1;
    STBIR_NO_UNROLL(decode);
    stbir__simdf8_load( d0, decode-16 );
    stbir__simdf8_load( d1, decode-16+8 );
    stbir__simdf8_0123to33333333( a0, d0 );
    stbir__simdf8_0123to33333333( a1, d1 );
    stbir__simdf8_mult( p0, a0, d0 );
    stbir__simdf8_mult( p1, a1, d1 );
    stbir__simdf8_bot4s( a0, d0, p0 );
    stbir__simdf8_bot4s( a1, d1, p1 );
    stbir__simdf8_top4s( d0, d0, p0 );
    stbir__simdf8_top4s( d1, d1, p1 );
    stbir__simdf8_store ( out, a0 );
    stbir__simdf8_store ( out+7, d0 );
    stbir__simdf8_store ( out+14, a1 );
    stbir__simdf8_store ( out+21, d1 );
    decode += 16;
    out += 28;
  }
  decode -= 16;
  #else
  decode += 8;
  STBIR_NO_UNROLL_LOOP_START
  while ( decode <= end_decode )
  {
    stbir__simdf d0,a0,d1,a1,p0,p1;
    STBIR_NO_UNROLL(decode);
    stbir__simdf_load( d0, decode-8 );
    stbir__simdf_load( d1, decode-8+4 );
    stbir__simdf_0123to3333( a0, d0 );
    stbir__simdf_0123to3333( a1, d1 );
    stbir__simdf_mult( p0, a0, d0 );
    stbir__simdf_mult( p1, a1, d1 );
    stbir__simdf_store ( out, d0 );
    stbir__simdf_store ( out+4, p0 );
    stbir__simdf_store ( out+7, d1 );
    stbir__simdf_store ( out+7+4, p1 );
    decode += 8;
    out += 14;
  }
  decode -= 8;
  #endif

  // might be one last odd pixel
  #ifdef STBIR_SIMD8
  STBIR_NO_UNROLL_LOOP_START
  while ( decode < end_decode )
  #else
  if ( decode < end_decode )
  #endif
  {
    stbir__simdf d,a,p;
    STBIR_NO_UNROLL(decode);
    stbir__simdf_load( d, decode );
    stbir__simdf_0123to3333( a, d );
    stbir__simdf_mult( p, a, d );
    stbir__simdf_store ( out, d );
    stbir__simdf_store ( out+4, p );
    decode += 4;
    out += 7;
  }

  #else

  while( decode < end_decode )
  {
    float r = decode[0], g = decode[1], b = decode[2], alpha = decode[3];
    out[0] = r;
    out[1] = g;
    out[2] = b;
    out[3] = alpha;
    out[4] = r * alpha;
    out[5] = g * alpha;
    out[6] = b * alpha;
    out += 7;
    decode += 4;
  }

  #endif
}